

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::
GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
          (ConstantManager *this,Type *type,SmallVector<unsigned_int,_2UL> *literal_words_or_ids)

{
  uint **ppuVar1;
  Constant *pCVar2;
  uint **ppuVar3;
  pointer puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  ppuVar1 = (uint **)(literal_words_or_ids->large_data_)._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  ppuVar3 = &literal_words_or_ids->small_data_;
  if (ppuVar1 != (uint **)0x0) {
    ppuVar3 = ppuVar1;
  }
  if (ppuVar1 == (uint **)0x0) {
    puVar4 = literal_words_or_ids->small_data_ + literal_words_or_ids->size_;
  }
  else {
    puVar4 = *(pointer *)
              &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar1 + 1))->_M_impl
    ;
  }
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,*ppuVar3,puVar4);
  pCVar2 = GetConstant(this,type,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pCVar2;
}

Assistant:

const Constant* GetConstant(const Type* type, const C& literal_words_or_ids) {
    return GetConstant(type, std::vector<uint32_t>(literal_words_or_ids.begin(),
                                                   literal_words_or_ids.end()));
  }